

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O3

int receive(int connection,void *buffer,int size,int busy_waiting)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t __n;
  
  __n = (size_t)size;
  if (busy_waiting == 0) {
    sVar2 = recv(connection,buffer,__n,0);
    iVar1 = -1;
    if ((long)__n <= sVar2) {
LAB_00102b7a:
      iVar1 = 0;
    }
  }
  else {
    do {
      sVar2 = recv(connection,buffer,__n,0);
      if ((long)__n <= sVar2) goto LAB_00102b7a;
      piVar3 = __errno_location();
    } while (*piVar3 == 0xb);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int receive(int connection, void* buffer, int size, int busy_waiting) {
	if (busy_waiting) {
		while (recv(connection, buffer, size, 0) < size) {
			if (errno != EAGAIN) return -1;
		}
	} else if (recv(connection, buffer, size, 0) < size) {
		return -1;
	}

	return 0;
}